

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::updatePartialsByPartition
          (BeagleCPUImpl<double,_1,_0> *this,int *operations,int count)

{
  _func_int **pp_Var1;
  int iVar2;
  
  pp_Var1 = (this->super_BeagleImpl)._vptr_BeagleImpl;
  if (this->kThreadingEnabled == true) {
    iVar2 = (*pp_Var1[0x3f])(this,operations,count);
    return iVar2;
  }
  iVar2 = (*pp_Var1[0x34])(this,1,operations,count,0xffffffff);
  return iVar2;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::updatePartialsByPartition(const int* operations,
                                                                 int count) {

    int returnCode = BEAGLE_ERROR_GENERAL;

    if (kThreadingEnabled) {
        returnCode = upPartialsByPartitionAsync(operations,
                                                count);
    } else {
        bool byPartition = true;
        returnCode = upPartials(byPartition,
                                operations,
                                count,
                                BEAGLE_OP_NONE);
    }

    return returnCode;
}